

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::ClearGeneratorMembers(cmGlobalGenerator *this)

{
  cmGlobalGenerator *this_local;
  
  cmDeleteAll<std::map<std::__cxx11::string,cmExportBuildFileGenerator*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>>
            (&this->BuildExportSets);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
  ::clear(&this->BuildExportSets);
  cmDeleteAll<std::vector<cmMakefile*,std::allocator<cmMakefile*>>>(&this->Makefiles);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::clear(&this->Makefiles);
  cmDeleteAll<std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>>
            (&this->LocalGenerators);
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::clear
            (&this->LocalGenerators);
  cmExportSetMap::clear(&this->ExportSets);
  std::
  map<const_cmGeneratorTarget_*,_cmTargetDependSet,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>_>
  ::clear(&this->TargetDependencies);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::clear(&this->TargetSearchIndex);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>_>
  ::clear(&this->GeneratorTargetSearchIndex);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefile_*>_>_>
  ::clear(&this->MakefileSearchIndex);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&this->ProjectMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
  ::clear(&this->RuleHashes);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent>_>_>
  ::clear(&this->DirectoryContentMap);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->BinaryDirectories);
  return;
}

Assistant:

void cmGlobalGenerator::ClearGeneratorMembers()
{
  cmDeleteAll(this->BuildExportSets);
  this->BuildExportSets.clear();

  cmDeleteAll(this->Makefiles);
  this->Makefiles.clear();

  cmDeleteAll(this->LocalGenerators);
  this->LocalGenerators.clear();

  this->ExportSets.clear();
  this->TargetDependencies.clear();
  this->TargetSearchIndex.clear();
  this->GeneratorTargetSearchIndex.clear();
  this->MakefileSearchIndex.clear();
  this->ProjectMap.clear();
  this->RuleHashes.clear();
  this->DirectoryContentMap.clear();
  this->BinaryDirectories.clear();
}